

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalNinjaGenerator::IsSingleConfigUtility
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target)

{
  TargetType TVar1;
  string *__k;
  const_iterator cVar2;
  bool bVar3;
  
  TVar1 = cmGeneratorTarget::GetType(target);
  if (TVar1 == UTILITY) {
    __k = cmGeneratorTarget::GetName_abi_cxx11_(target);
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->PerConfigUtilityTargets)._M_t,__k);
    bVar3 = (_Rb_tree_header *)cVar2._M_node ==
            &(this->PerConfigUtilityTargets)._M_t._M_impl.super__Rb_tree_header;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmGlobalNinjaGenerator::IsSingleConfigUtility(
  cmGeneratorTarget const* target) const
{
  return target->GetType() == cmStateEnums::UTILITY &&
    !this->PerConfigUtilityTargets.count(target->GetName());
}